

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O0

void __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertObj(ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *this,int i_obj)

{
  NodeRange src;
  LinkEntry be;
  bool bVar1;
  ValuePresolver *pVVar2;
  ModelValuesTerminal *pMVar3;
  SafeBool SVar4;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  size_t sVar5;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  double dVar6;
  MutObjective MVar7;
  exception *exc;
  LinearObjective lo;
  int qpres;
  EExpr qpnew;
  EExpr eexpr;
  NumericExpr e;
  LinTerms le;
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  auto_link_scope;
  NodeRange obj_src;
  MutObjective obj;
  QuadraticObjective *qo;
  NodeIndexRange this_01;
  undefined8 in_stack_fffffffffffff548;
  int index;
  ValueNode *c;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff550;
  NodeIndexRange this_02;
  undefined4 in_stack_fffffffffffff558;
  int in_stack_fffffffffffff55c;
  NodeIndexRange in_stack_fffffffffffff560;
  CopyLink *in_stack_fffffffffffff580;
  string *nm;
  ArrayRef<int> *v;
  undefined8 in_stack_fffffffffffff590;
  ArrayRef<double> *c_00;
  undefined4 in_stack_fffffffffffff598;
  Type in_stack_fffffffffffff59c;
  undefined8 in_stack_fffffffffffff5a0;
  undefined4 in_stack_fffffffffffff5a8;
  int in_stack_fffffffffffff5ac;
  ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&> *in_stack_fffffffffffff6c0;
  string local_780;
  ArrayRef<int> local_760;
  ArrayRef<double> local_738;
  LinearObjective local_710;
  int local_66c;
  type in_stack_fffffffffffff9c0;
  type in_stack_fffffffffffff9c8;
  AlgebraicExpression<mp::QuadAndLinTerms> local_2d8;
  ExprBase local_118 [16];
  NodeRange local_98;
  NodeRange local_80;
  pair<mp::pre::NodeRange,_mp::pre::NodeRange> local_70;
  NodeRange local_50;
  BasicProblem<mp::BasicProblemParams<int>_> *local_40;
  int local_38;
  BasicProblem<mp::BasicProblemParams<int>_> *local_20;
  int local_18;
  
  index = (int)((ulong)in_stack_fffffffffffff548 >> 0x20);
  (*(in_RDI->
    super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
    ).
    super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
    .
    super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
    ._vptr_BasicExprVisitor[0x12])();
  MVar7 = BasicProblem<mp::BasicProblemParams<int>_>::obj(in_stack_fffffffffffff550,index);
  local_40 = MVar7.
             super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
             .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_38 = MVar7.
             super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
             .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_20 = local_40;
  local_18 = local_38;
  pVVar2 = GetValuePresolver((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                              *)0x612f7a);
  pMVar3 = pre::ValuePresolverImpl::GetSourceNodes(&pVVar2->super_ValuePresolverImpl);
  pre::ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_>::
  GetObjValues(pMVar3);
  pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::operator()
            (in_stack_fffffffffffff6c0);
  local_50 = pre::ValueNode::Add((ValueNode *)in_stack_fffffffffffff560,in_stack_fffffffffffff55c);
  GetCopyLink((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               *)0x612fed);
  pVVar2 = GetValuePresolver((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                              *)0x613002);
  pMVar3 = pre::ValuePresolverImpl::GetTargetNodes(&pVVar2->super_ValuePresolverImpl);
  pre::ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_>::
  GetObjValues(pMVar3);
  pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::operator()
            (in_stack_fffffffffffff6c0);
  local_80 = pre::ValueNode::Add((ValueNode *)in_stack_fffffffffffff560,in_stack_fffffffffffff55c);
  std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>::
  pair<mp::pre::NodeRange_&,_mp::pre::NodeRange,_true>(&local_70,&local_50,&local_80);
  be.first.ir_.beg_ = in_stack_fffffffffffff598;
  be.first.pvn_ = (ValueNode *)in_stack_fffffffffffff590;
  be.first.ir_.end_ = in_stack_fffffffffffff59c;
  be.second.pvn_ = (ValueNode *)in_stack_fffffffffffff5a0;
  be.second.ir_.beg_ = in_stack_fffffffffffff5a8;
  be.second.ir_.end_ = in_stack_fffffffffffff5ac;
  pre::CopyLink::AddEntry(in_stack_fffffffffffff580,be);
  GetFlatCvt(in_RDI);
  src.pvn_._4_4_ = in_stack_fffffffffffff55c;
  src.pvn_._0_4_ = in_stack_fffffffffffff558;
  src.ir_ = in_stack_fffffffffffff560;
  local_98 = local_50;
  pre::
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::AutoLinkScope((AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                   *)local_70.second.ir_,
                  (FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                   *)local_70.second.pvn_,src);
  BasicProblem<mp::BasicProblemParams<int>_>::MutObjective::linear_expr((MutObjective *)0x6130fc);
  ToLinTerms((LinearExpr *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598));
  local_118[0].impl_ =
       (Impl *)BasicProblem<mp::BasicProblemParams<int>_>::
               BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
               ::nonlinear_expr((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                                 *)local_70.second.pvn_);
  EExpr::EExpr((EExpr *)0x613142);
  SVar4 = internal::ExprBase::operator_cast_to_function_pointer(local_118);
  qo = (QuadraticObjective *)local_70.first.pvn_;
  this_01 = local_70.first.ir_;
  c = local_70.second.pvn_;
  this_02 = local_70.second.ir_;
  if (SVar4 != 0) {
    BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
    BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
              ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)local_70.second.pvn_,
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)local_70.second.ir_,
               local_70.first.ir_.end_);
    BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
    ::Visit((BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
             *)in_stack_fffffffffffff9c0,(Expr)in_stack_fffffffffffff9c8.__align);
    EExpr::operator=((EExpr *)local_70.first.ir_,(EExpr *)local_70.first.pvn_);
    EExpr::~EExpr((EExpr *)0x6131d3);
    QuadAndLinTerms::GetLinTerms(&local_2d8.super_QuadAndLinTerms);
    LinTerms::add((LinTerms *)in_stack_fffffffffffff560,
                  (LinTerms *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    dVar6 = AlgebraicExpression<mp::QuadAndLinTerms>::constant_term(&local_2d8);
    if ((ABS(dVar6) != 0.0) ||
       (qo = (QuadraticObjective *)local_70.first.pvn_, this_01 = local_70.first.ir_,
       c = local_70.second.pvn_, this_02 = local_70.second.ir_, NAN(ABS(dVar6)))) {
      AlgebraicExpression<mp::QuadAndLinTerms>::constant_term(&local_2d8);
      MakeFixedVar((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                    *)local_70.second.ir_,(double)local_70.second.pvn_);
      LinTerms::add_term((LinTerms *)local_70.second.ir_,(double)local_70.second.pvn_,
                         local_70.first.ir_.end_);
      qo = (QuadraticObjective *)local_70.first.pvn_;
      this_01 = local_70.first.ir_;
      c = local_70.second.pvn_;
      this_02 = local_70.second.ir_;
    }
  }
  LinTerms::sort_terms
            ((LinTerms *)
             qpnew.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size,
             qpnew.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_capacity._7_1_);
  QuadAndLinTerms::GetQPTerms(&local_2d8.super_QuadAndLinTerms);
  QuadTerms::sort_terms((QuadTerms *)this_02);
  this_00 = &GetFlatCvt(in_RDI)->
             super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ;
  bVar1 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::IfPassQuadObj(this_00);
  if (!bVar1) {
    QuadAndLinTerms::GetQPTerms(&local_2d8.super_QuadAndLinTerms);
    sVar5 = QuadTerms::size((QuadTerms *)0x613332);
    if (sVar5 != 0) {
      EExpr::EExpr((EExpr *)0x613351);
      QuadAndLinTerms::GetQPTerms(&local_2d8.super_QuadAndLinTerms);
      QuadAndLinTerms::GetQPTerms((QuadAndLinTerms *)&stack0xfffffffffffff998);
      QuadTerms::operator=((QuadTerms *)this_01,(QuadTerms *)qo);
      local_66c = Convert2Var((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                               *)this_01,(EExpr *)qo);
      QuadAndLinTerms::GetQPTerms(&local_2d8.super_QuadAndLinTerms);
      QuadTerms::clear((QuadTerms *)this_01);
      LinTerms::add_term((LinTerms *)this_02,(double)c,this_01.end_);
      EExpr::~EExpr((EExpr *)0x6133eb);
    }
  }
  BasicProblem<mp::BasicProblemParams<int>_>::
  BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  ::type((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *)this_01);
  c_00 = &local_738;
  LinTerms::coefs((LinTerms *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  v = &local_760;
  LinTerms::vars((LinTerms *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  nm = &local_780;
  std::__cxx11::string::string((string *)nm);
  LinearObjective::LinearObjective<mp::ArrayRef<double>,mp::ArrayRef<int>>
            (&local_710,in_stack_fffffffffffff59c,c_00,v,nm);
  std::__cxx11::string::~string((string *)nm);
  ArrayRef<int>::~ArrayRef((ArrayRef<int> *)0x6134a7);
  ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x6134b1);
  GetFlatCvt(in_RDI);
  QuadAndLinTerms::GetQPTerms(&local_2d8.super_QuadAndLinTerms);
  QuadraticObjective::QuadraticObjective
            ((QuadraticObjective *)in_stack_fffffffffffff560,
             (LinearObjective *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),
             (QuadTerms *)this_02);
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::AddObjective((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  *)this_01,qo);
  QuadraticObjective::~QuadraticObjective((QuadraticObjective *)this_01);
  LinearObjective::~LinearObjective((LinearObjective *)this_01);
  EExpr::~EExpr((EExpr *)0x613546);
  LinTerms::~LinTerms((LinTerms *)this_01);
  pre::
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::~AutoLinkScope((AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                    *)in_RDI);
  return;
}

Assistant:

void ConvertObj(int i_obj) {
    try {
      typename ProblemType::MutObjective obj = GetModel().obj(i_obj);
      auto obj_src =              // source value node for this obj
          GetValuePresolver().GetSourceNodes().GetObjValues()().Add();
      GetCopyLink().AddEntry(
          {
           obj_src,
           GetValuePresolver().GetTargetNodes().GetObjValues()().Add() });
      /// After the CopyLink, add One2ManyLink for converted expressions.
      /// When postsolving, CopyLink is executed last and copies obj values.
      /// This should resolve the issue of the "max-out"
      /// value conflict resolution.
      /// Tested by suf_common/funcpieces_01_01_obj.mod.
      pre::AutoLinkScope<FlatConverterType> auto_link_scope{
          GetFlatCvt(), obj_src
      };
      auto le = ToLinTerms(obj.linear_expr());
      NumericExpr e = obj.nonlinear_expr();
      EExpr eexpr;
      if (e) {
        eexpr=MP_DISPATCH( Visit(e) );
        le.add(eexpr.GetLinTerms());
        if (std::fabs(eexpr.constant_term())!=0.0) {
          /// Not using objective constant, should we?
          le.add_term(1.0, MakeFixedVar(eexpr.constant_term()));
        }
      }
      /// Sort/merge terms, otherwise we lose repeated terms
      /// in Gurobi where we just set 'obj attributes'
      /// to variables.
      /// Context is propagated after adding all objectives.
      le.sort_terms();
      eexpr.GetQPTerms().sort_terms();
      if (!GetFlatCvt().IfPassQuadObj()            // SCIP 10
          && eexpr.GetQPTerms().size()) {
        EExpr qpnew;
        qpnew.GetQPTerms() = std::move(eexpr.GetQPTerms());
        int qpres = Convert2Var(std::move(qpnew));
        eexpr.GetQPTerms().clear();                // explicitly remove obj qp terms
        le.add_term(1.0, qpres);
      }
      /// Add linear / quadratic obj
      LinearObjective lo { obj.type(),
                         std::move(le.coefs()), std::move(le.vars()) };
      GetFlatCvt().AddObjective(
          QuadraticObjective{std::move(lo),
                             std::move(eexpr.GetQPTerms())});
    } catch (const std::exception& exc) {
      MP_RAISE(fmt::format(
          "Error flattening objective _obj[{}]:\n  {}", i_obj, exc.what()));
    }
  }